

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddDirectoryItem(cmComputeLinkInformation *this,string *item)

{
  cmMakefile *this_00;
  bool bVar1;
  bool local_6a;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *item_local;
  cmComputeLinkInformation *this_local;
  
  this_00 = this->Makefile;
  local_18 = item;
  item_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"APPLE",&local_39);
  bVar1 = cmMakefile::IsOn(this_00,&local_38);
  local_6a = false;
  if (bVar1) {
    local_6a = cmSystemTools::IsPathToFramework(local_18);
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (local_6a == false) {
    DropDirectoryItem(this,local_18);
  }
  else {
    AddFrameworkItem(this,local_18);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddDirectoryItem(std::string const& item)
{
  if (this->Makefile->IsOn("APPLE") &&
      cmSystemTools::IsPathToFramework(item)) {
    this->AddFrameworkItem(item);
  } else {
    this->DropDirectoryItem(item);
  }
}